

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AppendCustomCommandToOutput
          (cmMakefile *this,string *output,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmImplicitDependsList *implicit_depends,cmCustomCommandLines *commandLines)

{
  bool bVar1;
  undefined8 *puVar2;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  cmMakefile *local_e8;
  string local_e0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_90;
  GeneratorAction local_78;
  
  bVar1 = ValidateCustomCommand(this,commandLines);
  if (bVar1) {
    local_e8 = this;
    std::__cxx11::string::string(local_e0,(string *)output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c0,depends);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_a8,
             &implicit_depends->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            );
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_90,
               &commandLines->
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    local_f8 = (code *)0x0;
    pcStack_f0 = (code *)0x0;
    local_108._M_unused._M_object = (void *)0x0;
    local_108._8_8_ = 0;
    puVar2 = (undefined8 *)operator_new(0x70);
    *puVar2 = local_e8;
    std::__cxx11::string::string((string *)(puVar2 + 1),local_e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(puVar2 + 5),&local_c0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(puVar2 + 8),&local_a8);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)(puVar2 + 0xb),
               &local_90);
    pcStack_f0 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx:1237:7)>
                 ::_M_invoke;
    local_f8 = std::
               _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx:1237:7)>
               ::_M_manager;
    local_108._M_unused._M_object = puVar2;
    GeneratorAction::GeneratorAction(&local_78,(ActionT *)&local_108);
    AddGeneratorAction(this,&local_78);
    GeneratorAction::~GeneratorAction(&local_78);
    std::_Function_base::~_Function_base((_Function_base *)&local_108);
    AppendCustomCommandToOutput(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmImplicitDependsList_const&,cmCustomCommandLines_const&)
    ::$_0::~__0((__0 *)&local_e8);
  }
  return;
}

Assistant:

void cmMakefile::AppendCustomCommandToOutput(
  const std::string& output, const std::vector<std::string>& depends,
  const cmImplicitDependsList& implicit_depends,
  const cmCustomCommandLines& commandLines)
{
  // Validate custom commands.
  if (this->ValidateCustomCommand(commandLines)) {
    // Dispatch command creation to allow generator expressions in outputs.
    this->AddGeneratorAction(
      [=](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt) {
        BacktraceGuard guard(this->Backtrace, lfbt);
        detail::AppendCustomCommandToOutput(lg, lfbt, output, depends,
                                            implicit_depends, commandLines);
      });
  }
}